

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.cpp
# Opt level: O2

void printWrap(ostream *os,int leftPad,string *content)

{
  char cVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  size_type *local_80;
  string pad;
  size_type *local_58;
  string nextWord;
  
  uVar2 = (uint)content->_M_string_length;
  local_58 = &nextWord._M_string_length;
  nextWord._M_dataplus._M_p = (pointer)0x0;
  nextWord._M_string_length._0_1_ = 0;
  local_80 = &pad._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_80,(char)leftPad);
  uVar3 = 0x50 - leftPad;
  pad.field_2._8_8_ = (ulong)uVar2;
  nextWord.field_2._12_4_ = uVar3;
  for (lVar6 = 0; lVar6 <= (int)uVar2; lVar6 = lVar6 + 1) {
    if (((pad.field_2._8_8_ == lVar6) || (cVar1 = (content->_M_dataplus)._M_p[lVar6], cVar1 == '\n')
        ) || (cVar1 == ' ')) {
      if ((int)uVar3 < (int)(uint)nextWord._M_dataplus._M_p) {
        poVar5 = std::operator<<(os,'\n');
        std::operator<<(poVar5,(string *)&local_80);
        uVar3 = nextWord.field_2._12_4_;
      }
      std::operator<<(os,(string *)&local_58);
      uVar4 = ~(uint)nextWord._M_dataplus._M_p;
      if (0 < (int)(uVar3 + uVar4)) {
        std::operator<<(os,' ');
      }
      nextWord._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)local_58 = 0;
      uVar3 = uVar3 + uVar4;
      if ((content->_M_dataplus)._M_p[lVar6] == '\n') {
        std::operator<<(os,'\n');
        uVar3 = nextWord.field_2._12_4_;
      }
    }
    else {
      std::__cxx11::string::push_back((char)&local_58);
    }
  }
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void printWrap(std::ostream& os, int leftPad, const std::string& content) {
  int len = content.size();
  int space = SCREEN_WIDTH - leftPad;
  std::string nextWord;
  std::string pad(leftPad, ' ');
  for (int i = 0; i <= len; ++i) {
    if (i != len && content[i] != ' ' && content[i] != '\n') {
      nextWord += content[i];
    } else {
      if (static_cast<int>(nextWord.size()) > space) {
        os << '\n' << pad;
        space = SCREEN_WIDTH - leftPad;
      }
      os << nextWord;
      space -= nextWord.size() + 1;
      if (space > 0) {
        os << ' ';
      }
      nextWord.clear();
      if (content[i] == '\n') {
        os << '\n';
        space = SCREEN_WIDTH - leftPad;
      }
    }
  }
}